

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Bool tt_check_trickyness(FT_Face face)

{
  code *pcVar1;
  FT_Stream stream;
  bool bVar2;
  byte bVar3;
  int iVar4;
  FT_Error FVar5;
  FT_UInt32 FVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  char *__s;
  ulong uVar15;
  int local_b8 [34];
  
  if (face == (FT_Face)0x0) {
    return '\0';
  }
  __s = face->family_name;
  if (__s != (char *)0x0) {
    sVar7 = strlen(__s);
    if ((7 < sVar7) && (__s[6] == '+')) {
      lVar8 = 0;
      do {
        if (0x19 < (int)__s[lVar8] - 0x41U) goto LAB_0025b42a;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      __s = __s + 7;
    }
LAB_0025b42a:
    lVar8 = 0;
    do {
      pcVar9 = strstr(__s,&tt_check_trickyness_family_trick_names + lVar8);
      if (pcVar9 != (char *)0x0) {
        return '\x01';
      }
      lVar8 = lVar8 + 0x14;
    } while (lVar8 != 400);
  }
  local_b8[0x1c] = 0;
  local_b8[0x1d] = 0;
  local_b8[0x1e] = 0;
  local_b8[0x18] = 0;
  local_b8[0x19] = 0;
  local_b8[0x1a] = 0;
  local_b8[0x1b] = 0;
  local_b8[0x14] = 0;
  local_b8[0x15] = 0;
  local_b8[0x16] = 0;
  local_b8[0x17] = 0;
  local_b8[0x10] = 0;
  local_b8[0x11] = 0;
  local_b8[0x12] = 0;
  local_b8[0x13] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  uVar10 = (ulong)*(ushort *)&face[1].family_name;
  if (*(ushort *)&face[1].family_name == 0) {
    bVar2 = true;
  }
  else {
    uVar15 = 0;
    bVar2 = false;
    do {
      lVar13 = uVar15 * 0x20;
      lVar8 = *(long *)(face[1].style_name + lVar13);
      if (lVar8 == 0x63767420) {
        bVar2 = true;
        iVar11 = 0;
LAB_0025b4f7:
        lVar8 = 0;
        uVar10 = 0;
        do {
          if (*(long *)(face[1].style_name + lVar13 + 0x18) ==
              *(long *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                       (ulong)(uint)(iVar11 << 4) + 8 + lVar8 * 0x30)) {
            if (uVar10 == 0) {
              pcVar1 = (code *)face[3].generic.data;
              if (pcVar1 == (code *)0x0) {
                uVar10 = 0;
              }
              else {
                iVar4 = (*pcVar1)(face,*(undefined8 *)(face[1].style_name + lVar13),face->stream,0);
                uVar10 = 0;
                if (iVar4 == 0) {
                  stream = face->stream;
                  uVar10 = *(ulong *)(face[1].style_name + lVar13 + 0x18);
                  FVar5 = FT_Stream_EnterFrame(stream,uVar10);
                  if (FVar5 == 0) {
                    uVar14 = 0;
                    if (3 < uVar10) {
                      uVar14 = 0;
                      do {
                        FVar6 = FT_Stream_GetULong(stream);
                        uVar14 = uVar14 + FVar6;
                        uVar10 = uVar10 - 4;
                      } while (3 < uVar10);
                    }
                    if (uVar10 != 0) {
                      bVar12 = 0x18;
                      do {
                        bVar3 = FT_Stream_GetByte(stream);
                        uVar14 = uVar14 + ((uint)bVar3 << (bVar12 & 0x1f));
                        bVar12 = bVar12 - 8;
                        uVar10 = uVar10 - 1;
                      } while (uVar10 != 0);
                    }
                    FT_Stream_ExitFrame(stream);
                    uVar10 = (ulong)uVar14;
                  }
                  else {
                    uVar10 = 0;
                  }
                }
              }
            }
            iVar4 = local_b8[lVar8];
            if (*(ulong *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                          (ulong)(uint)(iVar11 << 4) + lVar8 * 0x30) == uVar10) {
              iVar4 = iVar4 + 1;
              local_b8[lVar8] = iVar4;
            }
            if (iVar4 == 3) {
              return '\x01';
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1f);
        uVar10 = (ulong)*(ushort *)&face[1].family_name;
      }
      else {
        if (lVar8 == 0x70726570) {
          iVar11 = 2;
          goto LAB_0025b4f7;
        }
        if (lVar8 == 0x6670676d) {
          iVar11 = 1;
          goto LAB_0025b4f7;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar10);
    bVar2 = !bVar2;
  }
  lVar8 = 0;
  while( true ) {
    iVar11 = local_b8[lVar8];
    if ((bool)(lVar8 - 0x10U < 0xc & bVar2)) {
      iVar11 = iVar11 + 1;
      local_b8[lVar8] = iVar11;
    }
    if (iVar11 == 3) break;
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x1f) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static FT_Bool
  tt_check_trickyness( FT_Face  face )
  {
    if ( !face )
      return FALSE;

    /* For first, check the face name for quick check. */
    if ( face->family_name                               &&
         tt_check_trickyness_family( face->family_name ) )
    {
      FT_TRACE3(( "found as a tricky font"
                  " by its family name: %s\n", face->family_name ));
      return TRUE;
    }

    /* Type42 fonts may lack `name' tables, we thus try to identify */
    /* tricky fonts by checking the checksums of Type42-persistent  */
    /* sfnt tables (`cvt', `fpgm', and `prep').                     */
    if ( tt_check_trickyness_sfnt_ids( (TT_Face)face ) )
    {
      FT_TRACE3(( "found as a tricky font"
                  " by its cvt/fpgm/prep table checksum\n" ));
      return TRUE;
    }

    return FALSE;
  }